

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O3

void av1_compute_global_motion_facade(AV1_COMP *cpi)

{
  FrameDistPair (*__base) [7];
  WarpedMotionParams *pWVar1;
  int32_t *piVar2;
  _Bool _Var3;
  byte bVar4;
  GM_SEARCH_TYPE GVar5;
  uint uVar6;
  int iVar7;
  AV1_PRIMARY *pAVar8;
  YV12_BUFFER_CONFIG *pYVar9;
  RefCntBuffer *pRVar10;
  bool bVar11;
  uint uVar12;
  bool bVar13;
  GlobalMotionData *pGVar14;
  bool bVar15;
  int iVar16;
  uint8_t *puVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  RefCntBuffer *pRVar23;
  FrameDistPair (*paFVar24) [7];
  long lVar25;
  bool bVar26;
  bool bVar27;
  
  _Var3 = (cpi->oxcf).tool_cfg.enable_global_motion;
  if ((_Var3 == true) && (cpi->gf_frame_index == '\0')) {
    pAVar8 = cpi->ppi;
    pAVar8->valid_gm_model_found[0] = 0x7fffffff;
    pAVar8->valid_gm_model_found[1] = 0x7fffffff;
    pAVar8->valid_gm_model_found[2] = 0x7fffffff;
    pAVar8->valid_gm_model_found[3] = 0x7fffffff;
    pAVar8->valid_gm_model_found[4] = 0x7fffffff;
    pAVar8->valid_gm_model_found[5] = 0x7fffffff;
    pAVar8->valid_gm_model_found[6] = 0x7fffffff;
  }
  if (((((cpi->common).current_frame.frame_type == '\x01') &&
       (pYVar9 = cpi->source, pYVar9 != (YV12_BUFFER_CONFIG *)0x0 && _Var3 == true)) &&
      ((cpi->gm_info).search_done == false)) && ((cpi->sf).gm_sf.gm_search_type != '\x04')) {
    (cpi->gm_info).segment_map_w = (pYVar9->field_2).field_0.y_crop_width + 0x1f >> 5;
    (cpi->gm_info).segment_map_h = (pYVar9->field_3).field_0.y_crop_height + 0x1f >> 5;
    (cpi->gm_info).reference_frames[0][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][6].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][6].frame = 0xffffffff;
    (cpi->gm_info).num_ref_frames[0] = 0;
    (cpi->gm_info).num_ref_frames[1] = 0;
    pAVar8 = cpi->ppi;
    if ((cpi->sf).inter_sf.selective_ref_frame < 1) {
      bVar15 = true;
    }
    else {
      bVar4 = (pAVar8->gf_group).update_type[cpi->gf_frame_index];
      bVar15 = bVar4 == 0 || (bVar4 & 0xfe) == 2;
    }
    __base = (cpi->gm_info).reference_frames;
    if ((((cpi->sf).gm_sf.disable_gm_search_based_on_stats == 0) ||
        ((pAVar8->gf_group).arf_index < 0)) ||
       ((pAVar8->valid_gm_model_found[3] != 0 || (pAVar8->valid_gm_model_found[6] != 0)))) {
      bVar27 = false;
    }
    else {
      bVar27 = pAVar8->valid_gm_model_found[1] == 0;
    }
    uVar6 = ((cpi->common).cur_frame)->pyramid_level;
    uVar20 = 7;
    do {
      if (((byte)((char)uVar20 - 1U) < 8) &&
         (lVar22 = (long)(cpi->common).remapped_ref_idx[uVar20 - 1], lVar22 != -1)) {
        pRVar23 = (cpi->common).ref_frame_map[lVar22];
      }
      else {
        pRVar23 = (RefCntBuffer *)0x0;
      }
      uVar21 = cpi->ref_frame_flags;
      bVar4 = ""[uVar20];
      (cpi->gm_info).ref_buf[uVar20] = (YV12_BUFFER_CONFIG *)0x0;
      piVar2 = (cpi->common).global_motion[uVar20].wmmat + 4;
      piVar2[0] = 0;
      piVar2[1] = 0x10000;
      *(undefined8 *)(piVar2 + 2) = 0;
      pWVar1 = (cpi->common).global_motion + uVar20;
      pWVar1->wmmat[0] = 0;
      pWVar1->wmmat[1] = 0;
      pWVar1->wmmat[2] = 0x10000;
      pWVar1->wmmat[3] = 0;
      pWVar1 = (cpi->common).global_motion + uVar20;
      pWVar1->wmtype = '\0';
      pWVar1->invalid = '\0';
      *(undefined2 *)&pWVar1->field_0x22 = 0;
      if ((pRVar23 != (RefCntBuffer *)0x0) &&
         (((uVar21 & bVar4) != 0 || ((cpi->sf).hl_sf.recode_loop == '\0')))) {
        (cpi->gm_info).ref_buf[uVar20] = &pRVar23->buf;
        if ((bVar15) || (iVar16 = (cpi->sf).inter_sf.selective_ref_frame, iVar16 < 2)) {
LAB_001d6531:
          bVar11 = false;
        }
        else {
          pRVar10 = (cpi->common).cur_frame;
          lVar25 = (long)(uVar20 << 0x18) >> 0x18;
          lVar22 = 3;
          bVar11 = true;
          do {
            bVar26 = bVar11;
            if ((lVar22 == lVar25) &&
               ((int)pRVar10->ref_display_order_hint[lVar25 + -1] <
                (int)pRVar10->ref_display_order_hint[3])) {
              bVar11 = true;
              goto LAB_001d6533;
            }
            lVar22 = 2;
            bVar11 = false;
          } while (bVar26);
          if (iVar16 == 2) goto LAB_001d6531;
          lVar22 = 6;
          bVar26 = true;
          do {
            while (lVar22 != lVar25) {
              lVar22 = 5;
              bVar11 = false;
              bVar13 = !bVar26;
              bVar26 = false;
              if (bVar13) goto LAB_001d6533;
            }
            lVar22 = 5;
            bVar11 = (bool)(bVar26 & (int)pRVar10->ref_display_order_hint[0] <=
                                     (int)pRVar10->ref_display_order_hint[lVar25 + -1]);
            bVar26 = false;
          } while (bVar11);
          bVar11 = (int)pRVar10->ref_display_order_hint[lVar25 + -1] <
                   (int)pRVar10->ref_display_order_hint[0];
        }
LAB_001d6533:
        if ((((pRVar23->buf).field_2.field_0.y_crop_width ==
              (cpi->source->field_2).field_0.y_crop_width) &&
            ((pRVar23->buf).field_3.field_0.y_crop_height ==
             (cpi->source->field_3).field_0.y_crop_height)) &&
           (GVar5 = (cpi->sf).gm_sf.gm_search_type, GVar5 != '\x04')) {
          if (GVar5 == '\x02') {
            bVar26 = uVar20 != 6 && ((uint)uVar20 & 0x7ffffffe) != 2;
          }
          else {
            bVar26 = true;
            if (GVar5 == '\x01') {
              bVar26 = ((uint)uVar20 & 0x7ffffffe) != 2;
            }
          }
          if ((!(bool)(bVar11 | ~bVar26 & 1U | bVar27 | (int)uVar6 < (int)pRVar23->pyramid_level))
             && (uVar21 = pRVar23->display_order_hint -
                          ((cpi->common).cur_frame)->display_order_hint, uVar21 != 0)) {
            uVar19 = ~uVar21 >> 0x1f;
            paFVar24 = (cpi->gm_info).reference_frames + 1;
            if ((int)uVar21 < 0) {
              paFVar24 = __base;
            }
            uVar12 = -uVar21;
            if (0 < (int)uVar21) {
              uVar12 = uVar21;
            }
            (*paFVar24)[(cpi->gm_info).num_ref_frames[uVar19]].distance = uVar12;
            iVar16 = (cpi->gm_info).num_ref_frames[uVar19];
            (*paFVar24)[iVar16].frame = (char)uVar20;
            (cpi->gm_info).num_ref_frames[uVar19] = iVar16 + 1;
          }
        }
      }
      bVar11 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar11);
    qsort(__base,(long)(cpi->gm_info).num_ref_frames[0],8,compare_distance);
    qsort((cpi->gm_info).reference_frames + 1,(long)(cpi->gm_info).num_ref_frames[1],8,
          compare_distance);
    if ((cpi->sf).gm_sf.gm_search_type == '\x03') {
      iVar7 = (cpi->gm_info).num_ref_frames[0];
      if ((cpi->gm_info).num_ref_frames[1] < 1) {
        iVar16 = 2;
        if (iVar7 < 2) {
          iVar16 = iVar7;
        }
        (cpi->gm_info).num_ref_frames[0] = iVar16;
      }
      else {
        iVar16 = 1;
        if (iVar7 < 1) {
          iVar16 = iVar7;
        }
        (cpi->gm_info).num_ref_frames[0] = iVar16;
        (cpi->gm_info).num_ref_frames[1] = 1;
      }
    }
    else {
      iVar16 = (cpi->gm_info).num_ref_frames[0];
    }
    if ((iVar16 != 0) || ((cpi->gm_info).num_ref_frames[1] != 0)) {
      puVar17 = (uint8_t *)
                aom_malloc((long)(cpi->gm_info).segment_map_h * (long)(cpi->gm_info).segment_map_w);
      (cpi->td).gm_data.segment_map = puVar17;
      if (puVar17 == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->segment_map");
      }
      (cpi->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (cpi->td).gm_data.motion_models[0].num_inliers = 0;
      *(undefined4 *)&(cpi->td).gm_data.motion_models[0].field_0x3c = 0;
      pGVar14 = &(cpi->td).gm_data;
      pGVar14->motion_models[0].params[4] = 0.0;
      pGVar14->motion_models[0].params[5] = 0.0;
      pGVar14 = &(cpi->td).gm_data;
      pGVar14->motion_models[0].params[2] = 0.0;
      pGVar14->motion_models[0].params[3] = 0.0;
      (cpi->td).gm_data.motion_models[0].params[0] = 0.0;
      (cpi->td).gm_data.motion_models[0].params[1] = 0.0;
      piVar18 = (int *)aom_malloc(0x8000);
      (cpi->td).gm_data.motion_models[0].inliers = piVar18;
      if (piVar18 == (int *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->motion_models[m].inliers");
      }
      if ((cpi->mt_info).num_workers < 2) {
        global_motion_estimation(cpi);
      }
      else {
        av1_global_motion_estimation_mt(cpi);
      }
      aom_free((cpi->td).gm_data.segment_map);
      (cpi->td).gm_data.segment_map = (uint8_t *)0x0;
      aom_free((cpi->td).gm_data.motion_models[0].inliers);
      (cpi->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (cpi->gm_info).search_done = true;
    }
  }
  memcpy(((cpi->common).cur_frame)->global_motion,(cpi->common).global_motion,0x120);
  return;
}

Assistant:

void av1_compute_global_motion_facade(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  GlobalMotionInfo *const gm_info = &cpi->gm_info;

  if (cpi->oxcf.tool_cfg.enable_global_motion) {
    if (cpi->gf_frame_index == 0) {
      for (int i = 0; i < FRAME_UPDATE_TYPES; i++) {
        cpi->ppi->valid_gm_model_found[i] = INT32_MAX;
#if CONFIG_FPMT_TEST
        if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
          cpi->ppi->temp_valid_gm_model_found[i] = INT32_MAX;
#endif
      }
    }
  }

  if (cpi->common.current_frame.frame_type == INTER_FRAME && cpi->source &&
      cpi->oxcf.tool_cfg.enable_global_motion && !gm_info->search_done &&
      cpi->sf.gm_sf.gm_search_type != GM_DISABLE_SEARCH) {
    setup_global_motion_info_params(cpi);
    // Terminate early if the total number of reference frames is zero.
    if (cpi->gm_info.num_ref_frames[0] || cpi->gm_info.num_ref_frames[1]) {
      gm_alloc_data(cpi, &cpi->td.gm_data);
      if (cpi->mt_info.num_workers > 1)
        av1_global_motion_estimation_mt(cpi);
      else
        global_motion_estimation(cpi);
      gm_dealloc_data(&cpi->td.gm_data);
      gm_info->search_done = 1;
    }
  }
  memcpy(cm->cur_frame->global_motion, cm->global_motion,
         sizeof(cm->cur_frame->global_motion));
}